

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O1

uint32_t VP8LPredictor12_C(uint32_t *left,uint32_t *top)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = *left;
  uVar4 = top[-1];
  uVar2 = *top;
  uVar5 = ((uVar2 >> 0x18) + (uVar1 >> 0x18)) - (uVar4 >> 0x18);
  uVar3 = ~uVar5 >> 0x18;
  if (uVar5 < 0x100) {
    uVar3 = uVar5;
  }
  uVar6 = ((uVar2 >> 0x10 & 0xff) + (uVar1 >> 0x10 & 0xff)) - (uVar4 >> 0x10 & 0xff);
  uVar5 = ~uVar6 >> 0x18;
  if (uVar6 < 0x100) {
    uVar5 = uVar6;
  }
  uVar7 = ((uVar2 >> 8 & 0xff) + (uVar1 >> 8 & 0xff)) - (uVar4 >> 8 & 0xff);
  uVar6 = ~uVar7 >> 0x18;
  if (uVar7 < 0x100) {
    uVar6 = uVar7;
  }
  uVar4 = ((uVar2 & 0xff) + (uVar1 & 0xff)) - (uVar4 & 0xff);
  uVar1 = ~uVar4 >> 0x18;
  if (uVar4 < 0x100) {
    uVar1 = uVar4;
  }
  return uVar6 * 0x100 + uVar5 * 0x10000 + uVar3 * 0x1000000 + uVar1;
}

Assistant:

uint32_t VP8LPredictor12_C(const uint32_t* const left,
                           const uint32_t* const top) {
  const uint32_t pred = ClampedAddSubtractFull(*left, top[0], top[-1]);
  return pred;
}